

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_mark.cpp
# Opt level: O1

void duckdb::NestedLoopJoinMark::Perform
               (DataChunk *left,ColumnDataCollection *right,bool *found_match,
               vector<duckdb::JoinCondition,_true> *conditions)

{
  idx_t lcount;
  idx_t rcount;
  bool bVar1;
  reference left_00;
  reference right_00;
  const_reference pvVar2;
  size_type __n;
  DataChunk scan_chunk;
  ColumnDataScanState scan_state;
  DataChunk local_f0;
  ColumnDataScanState local_b0;
  
  local_b0.current_chunk_state.handles._M_h._M_buckets =
       &local_b0.current_chunk_state.handles._M_h._M_single_bucket;
  local_b0.current_chunk_state.handles._M_h._M_bucket_count = 1;
  local_b0.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.current_chunk_state.handles._M_h._M_element_count = 0;
  local_b0.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  local_b0.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0.current_chunk_state.properties = INVALID;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ColumnDataCollection::InitializeScan(right,&local_b0,ALLOW_ZERO_COPY);
  DataChunk::DataChunk(&local_f0);
  ColumnDataCollection::InitializeScanChunk(right,&local_f0);
  while (bVar1 = ColumnDataCollection::Scan(right,&local_b0,&local_f0), bVar1) {
    if ((conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
        super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        left_00 = vector<duckdb::Vector,_true>::operator[](&left->data,__n);
        right_00 = vector<duckdb::Vector,_true>::operator[](&local_f0.data,__n);
        rcount = local_f0.count;
        lcount = left->count;
        pvVar2 = vector<duckdb::JoinCondition,_true>::operator[](conditions,__n);
        MarkJoinComparisonSwitch(left_00,right_00,lcount,rcount,found_match,pvVar2->comparison);
        __n = __n + 1;
      } while (__n < (ulong)(((long)(conditions->
                                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    ).
                                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(conditions->
                                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    ).
                                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
    }
  }
  DataChunk::~DataChunk(&local_f0);
  if (local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_b0);
  return;
}

Assistant:

void NestedLoopJoinMark::Perform(DataChunk &left, ColumnDataCollection &right, bool found_match[],
                                 const vector<JoinCondition> &conditions) {
	// initialize a new temporary selection vector for the left chunk
	// loop over all chunks in the RHS
	ColumnDataScanState scan_state;
	right.InitializeScan(scan_state);

	DataChunk scan_chunk;
	right.InitializeScanChunk(scan_chunk);

	while (right.Scan(scan_state, scan_chunk)) {
		for (idx_t i = 0; i < conditions.size(); i++) {
			MarkJoinComparisonSwitch(left.data[i], scan_chunk.data[i], left.size(), scan_chunk.size(), found_match,
			                         conditions[i].comparison);
		}
	}
}